

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Version::Unref(Version *this)

{
  Version *this_local;
  
  if (this == &this->vset_->dummy_versions_) {
    __assert_fail("this != &vset_->dummy_versions_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x1c8,"void leveldb::Version::Unref()");
  }
  if (this->refs_ < 1) {
    __assert_fail("refs_ >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x1c9,"void leveldb::Version::Unref()");
  }
  this->refs_ = this->refs_ + -1;
  if ((this->refs_ == 0) && (this != (Version *)0x0)) {
    ~Version(this);
    operator_delete(this);
  }
  return;
}

Assistant:

void Version::Unref() {
  assert(this != &vset_->dummy_versions_);
  assert(refs_ >= 1);
  --refs_;
  if (refs_ == 0) {
    delete this;
  }
}